

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O0

char * vkb::to_string(InstanceError err)

{
  char *pcStack_10;
  InstanceError err_local;
  
  switch(err) {
  case vulkan_unavailable:
    pcStack_10 = "vulkan_unavailable";
    break;
  case vulkan_version_unavailable:
    pcStack_10 = "vulkan_version_unavailable";
    break;
  case vulkan_version_1_1_unavailable:
    pcStack_10 = "vulkan_version_1_1_unavailable";
    break;
  case vulkan_version_1_2_unavailable:
    pcStack_10 = "vulkan_version_1_2_unavailable";
    break;
  case vulkan_version_1_3_unavailable:
    pcStack_10 = "vulkan_version_1_3_unavailable";
    break;
  case vulkan_version_1_4_unavailable:
    pcStack_10 = "vulkan_version_1_4_unavailable";
    break;
  case failed_create_instance:
    pcStack_10 = "failed_create_instance";
    break;
  case failed_create_debug_messenger:
    pcStack_10 = "failed_create_debug_messenger";
    break;
  case requested_layers_not_present:
    pcStack_10 = "requested_layers_not_present";
    break;
  case requested_extensions_not_present:
    pcStack_10 = "requested_extensions_not_present";
    break;
  case windowing_extensions_not_present:
    pcStack_10 = "windowing_extensions_not_present";
    break;
  default:
    pcStack_10 = "";
  }
  return pcStack_10;
}

Assistant:

const char* to_string(InstanceError err) {
    switch (err) {
        CASE_TO_STRING(InstanceError, vulkan_unavailable)
        CASE_TO_STRING(InstanceError, vulkan_version_unavailable)
        CASE_TO_STRING(InstanceError, vulkan_version_1_1_unavailable)
        CASE_TO_STRING(InstanceError, vulkan_version_1_2_unavailable)
        CASE_TO_STRING(InstanceError, vulkan_version_1_3_unavailable)
        CASE_TO_STRING(InstanceError, vulkan_version_1_4_unavailable)
        CASE_TO_STRING(InstanceError, failed_create_debug_messenger)
        CASE_TO_STRING(InstanceError, failed_create_instance)
        CASE_TO_STRING(InstanceError, requested_layers_not_present)
        CASE_TO_STRING(InstanceError, requested_extensions_not_present)
        CASE_TO_STRING(InstanceError, windowing_extensions_not_present)
        default:
            return "";
    }
}